

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QVariant>::insert
          (QMovableArrayOps<QVariant> *this,qsizetype i,qsizetype n,parameter_type t)

{
  long lVar1;
  QArrayDataPointer<QVariant> *in_RCX;
  long in_RDX;
  long in_RSI;
  QArrayDataPointer<QVariant> *in_RDI;
  long in_FS_OFFSET;
  GrowthPosition pos;
  bool growsAtBegin;
  QVariant copy;
  QVariant *in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff78;
  uint uVar2;
  undefined4 in_stack_ffffffffffffff7c;
  Inserter *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff8c;
  GrowthPosition where;
  long local_68;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ::QVariant::QVariant((QVariant *)in_RDI,in_stack_ffffffffffffff68);
  uVar2 = in_stack_ffffffffffffff78 & 0xffffff;
  if (in_RDI->size != 0) {
    uVar2 = CONCAT13(in_RSI == 0,(int3)in_stack_ffffffffffffff78);
  }
  where = CONCAT13((char)(uVar2 >> 0x18),(int3)in_stack_ffffffffffffff8c);
  QArrayDataPointer<QVariant>::detachAndGrow
            (in_RCX,where,(qsizetype)in_stack_ffffffffffffff80,
             (QVariant **)CONCAT44(in_stack_ffffffffffffff7c,uVar2),in_RDI);
  local_68 = in_RDX;
  if ((where & 0x1000000) == GrowsAtEnd) {
    Inserter::Inserter(in_stack_ffffffffffffff80,
                       (QArrayDataPointer<QVariant> *)CONCAT44(in_stack_ffffffffffffff7c,uVar2),
                       (qsizetype)in_RDI,(qsizetype)in_stack_ffffffffffffff68);
    Inserter::insertFill
              (in_stack_ffffffffffffff80,(QVariant *)CONCAT44(in_stack_ffffffffffffff7c,uVar2),
               (qsizetype)in_RDI);
    Inserter::~Inserter(in_stack_ffffffffffffff80);
  }
  else {
    while (local_68 != 0) {
      QArrayDataPointer<QVariant>::begin((QArrayDataPointer<QVariant> *)0x3c4ecb);
      ::QVariant::QVariant((QVariant *)in_RDI,in_stack_ffffffffffffff68);
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      local_68 = local_68 + -1;
    }
  }
  ::QVariant::~QVariant((QVariant *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }